

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

int pr_psupp(part_t *part,int mode)

{
  undefined8 in_RDI;
  long i;
  undefined4 in_stack_00000008;
  int in_stack_000000b8;
  int in_stack_000000bc;
  long local_18;
  
  if (pr_psupp::ps_fp == (FILE *)0x0) {
    pr_psupp::ps_fp = print_prep(in_stack_000000bc,in_stack_000000b8);
  }
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    dbg_print(part._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),(void *)i,
              (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    dbg_print(part._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),(void *)i,
              (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    dbg_print(part._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),(void *)i,
              (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    dbg_print(part._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),(void *)i,
              (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    dbg_print(part._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),(void *)i,
              (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    fprintf((FILE *)pr_psupp::ps_fp,"\n");
  }
  return 0;
}

Assistant:

int
pr_psupp(part_t *part, int mode)
{
    static FILE *ps_fp = NULL;
    long      i;

    if (ps_fp == NULL)
        ps_fp = print_prep(PSUPP, mode);

   for (i = 0; i < SUPP_PER_PART; i++)
      {
      PR_STRT(ps_fp);
      PR_HUGE(ps_fp, &part->s[i].partkey);
      PR_HUGE(ps_fp, &part->s[i].suppkey);
      PR_HUGE(ps_fp, &part->s[i].qty);
      PR_MONEY(ps_fp, &part->s[i].scost);
      PR_VSTR_LAST(ps_fp, part->s[i].comment,part->s[i].clen);
      PR_END(ps_fp);
      }

   return(0);
}